

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

uint64_t io_readx(CPUArchState_conflict28 *env,CPUIOTLBEntry *iotlbentry,int mmu_idx,
                 target_ulong_conflict addr,uintptr_t retaddr,MMUAccessType access_type,MemOp op)

{
  uint64_t uStack_60;
  MemTxResult r;
  uint64_t val;
  MemoryRegion_conflict *mr;
  MemoryRegionSection *section;
  hwaddr mr_offset;
  uc_struct_conflict15 *uc;
  CPUState *cpu;
  uintptr_t uStack_28;
  MMUAccessType access_type_local;
  uintptr_t retaddr_local;
  target_ulong_conflict addr_local;
  int mmu_idx_local;
  CPUIOTLBEntry *iotlbentry_local;
  CPUArchState_conflict28 *env_local;
  
  cpu._4_4_ = access_type;
  uStack_28 = retaddr;
  retaddr_local._0_4_ = addr;
  retaddr_local._4_4_ = mmu_idx;
  _addr_local = iotlbentry;
  iotlbentry_local = (CPUIOTLBEntry *)env;
  uc = (uc_struct_conflict15 *)env_cpu(env);
  mr_offset = (hwaddr)((CPUState *)uc)->uc;
  mr = (MemoryRegion_conflict *)
       iotlb_to_section_tricore((CPUState *)uc,_addr_local->addr,_addr_local->attrs);
  val = (uint64_t)mr->ops;
  section = (MemoryRegionSection *)
            ((_addr_local->addr & 0xffffc000) + (ulong)(target_ulong_conflict)retaddr_local);
  uc[2].jmp_bufs[7][0].__jmpbuf[0] = uStack_28;
  if (*(int *)((long)uc[2].jmp_bufs[7][0].__jmpbuf + 0x24) == 0) {
    cpu_io_recompile_tricore((CPUState *)uc,uStack_28);
  }
  memory_region_dispatch_read_tricore
            ((uc_struct_conflict15 *)mr_offset,(MemoryRegion_conflict *)val,(hwaddr)section,
             &stack0xffffffffffffffa0,op,_addr_local->attrs);
  return uStack_60;
}

Assistant:

static uint64_t io_readx(CPUArchState *env, CPUIOTLBEntry *iotlbentry,
                         int mmu_idx, target_ulong addr, uintptr_t retaddr,
                         MMUAccessType access_type, MemOp op)
{
    CPUState *cpu = env_cpu(env);
    struct uc_struct *uc = cpu->uc;
    hwaddr mr_offset;
    MemoryRegionSection *section;
    MemoryRegion *mr;
    uint64_t val;
    MemTxResult r;

    section = iotlb_to_section(cpu, iotlbentry->addr, iotlbentry->attrs);
    mr = section->mr;
    mr_offset = (iotlbentry->addr & TARGET_PAGE_MASK) + addr;
    cpu->mem_io_pc = retaddr;
    if (!cpu->can_do_io) {
        cpu_io_recompile(cpu, retaddr);
    }

    r = memory_region_dispatch_read(uc, mr, mr_offset, &val, op, iotlbentry->attrs);
    if (r != MEMTX_OK) {
#if 0
        hwaddr physaddr = mr_offset +
            section->offset_within_address_space -
            section->offset_within_region;

        cpu_transaction_failed(cpu, physaddr, addr, memop_size(op), access_type,
                               mmu_idx, iotlbentry->attrs, r, retaddr);
#endif
    }

    return val;
}